

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O1

boolean walk_path(coord *src_cc,coord *dest_cc,_func_boolean_void_ptr_int_int *check_proc,void *arg)

{
  boolean bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  bool bVar15;
  
  iVar5 = (int)src_cc->x;
  uVar3 = dest_cc->x - iVar5;
  iVar9 = (int)src_cc->y;
  uVar7 = dest_cc->y - iVar9;
  uVar8 = -uVar3;
  if (0 < (int)uVar3) {
    uVar8 = uVar3;
  }
  uVar8 = uVar8 & 0xff;
  uVar4 = (int)uVar3 >> 0x1f | 1;
  uVar3 = -uVar7;
  if (0 < (int)uVar7) {
    uVar3 = uVar7;
  }
  uVar3 = uVar3 & 0xff;
  uVar7 = (int)uVar7 >> 0x1f | 1;
  if (uVar8 < uVar3) {
    iVar13 = 0;
    iVar14 = iVar5;
    iVar10 = iVar9;
    uVar11 = uVar3;
    do {
      iVar9 = iVar10;
      iVar5 = iVar14;
      iVar13 = iVar13 + uVar8;
      uVar6 = 0;
      if ((int)uVar3 <= iVar13) {
        uVar6 = uVar4;
      }
      iVar10 = iVar9 + uVar7;
      bVar1 = (*check_proc)(arg,uVar6 + iVar5,iVar10);
      bVar15 = bVar1 == '\0';
      if (bVar15) break;
      uVar2 = 0;
      if ((int)uVar3 <= iVar13) {
        uVar2 = uVar3;
      }
      iVar13 = iVar13 - uVar2;
      uVar11 = uVar11 - 1;
      iVar14 = uVar6 + iVar5;
    } while (uVar11 != 0);
  }
  else {
    iVar14 = 0;
    if (dest_cc->x == src_cc->x) {
      bVar15 = false;
    }
    else {
      iVar12 = uVar8 + (uVar8 == 0);
      iVar10 = iVar5;
      iVar13 = iVar9;
      do {
        iVar9 = iVar13;
        iVar5 = iVar10;
        iVar14 = iVar14 + uVar3;
        uVar11 = 0;
        if ((int)uVar8 <= iVar14) {
          uVar11 = uVar7;
        }
        iVar10 = iVar5 + uVar4;
        bVar1 = (*check_proc)(arg,iVar10,uVar11 + iVar9);
        bVar15 = bVar1 == '\0';
        if (bVar15) break;
        uVar6 = 0;
        if ((int)uVar8 <= iVar14) {
          uVar6 = uVar8;
        }
        iVar14 = iVar14 - uVar6;
        iVar12 = iVar12 + -1;
        iVar13 = uVar11 + iVar9;
      } while (iVar12 != 0);
    }
  }
  if (bVar15) {
    dest_cc->x = (xchar)iVar5;
    dest_cc->y = (xchar)iVar9;
  }
  return !bVar15;
}

Assistant:

boolean walk_path(coord *src_cc, coord *dest_cc,
		  boolean (*check_proc)(void *, int, int), void *arg)
{
    int x, y, dx, dy, x_change, y_change, err, i, prev_x, prev_y;
    boolean keep_going = TRUE;

    /* Use Bresenham's Line Algorithm to walk from src to dest */
    dx = dest_cc->x - src_cc->x;
    dy = dest_cc->y - src_cc->y;
    prev_x = x = src_cc->x;
    prev_y = y = src_cc->y;

    if (dx < 0) {
	x_change = -1;
	dx = -dx;
    } else
	x_change = 1;
    if (dy < 0) {
	y_change = -1;
	dy = -dy;
    } else
	y_change = 1;

    i = err = 0;
    if (dx < dy) {
	while (i++ < dy) {
	    prev_x = x;
	    prev_y = y;
	    y += y_change;
	    err += dx;
	    if (err >= dy) {
		x += x_change;
		err -= dy;
	    }
	/* check for early exit condition */
	if (!(keep_going = (*check_proc)(arg, x, y)))
	    break;
	}
    } else {
	while (i++ < dx) {
	    prev_x = x;
	    prev_y = y;
	    x += x_change;
	    err += dy;
	    if (err >= dx) {
		y += y_change;
		err -= dx;
	    }
	/* check for early exit condition */
	if (!(keep_going = (*check_proc)(arg, x, y)))
	    break;
	}
    }

    if (keep_going)
	return TRUE;	/* successful */

    dest_cc->x = prev_x;
    dest_cc->y = prev_y;
    return FALSE;
}